

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int pull_elements_confidential
              (uchar **cursor,size_t *max,uchar **value,size_t *val_len,size_t prefixA,
              size_t prefixB,size_t prefixed_size,size_t explicit_size)

{
  byte bVar1;
  uchar *puVar2;
  
  bVar1 = peek_u8(cursor,max);
  if (bVar1 != 1) {
    if (bVar1 == 0) {
      pull_u8(cursor,max);
      *value = (uchar *)0x0;
      prefixed_size = 0;
      goto LAB_00109944;
    }
    prefixed_size = 0x21;
    if (bVar1 != prefixA && bVar1 != prefixB) {
      return -2;
    }
  }
  puVar2 = pull_skip(cursor,max,prefixed_size);
  *value = puVar2;
  if (*cursor == (uchar *)0x0) {
    return -2;
  }
LAB_00109944:
  *val_len = prefixed_size;
  return 0;
}

Assistant:

static int pull_elements_confidential(const unsigned char **cursor, size_t *max,
                                      const unsigned char **value, size_t *val_len,
                                      size_t prefixA, size_t prefixB,
                                      size_t prefixed_size, size_t explicit_size)
{
    /* First byte is always the 'version' which tells you what the value is */
    const uint8_t type = peek_u8(cursor, max);
    size_t size;

    if (type == 0) {
        /* Empty, Pop off the type */
        pull_u8(cursor, max);
        *value = NULL;
        *val_len = 0;
        return WALLY_OK;
    }

    if (type == 1)
        size = explicit_size;
    else if (type == prefixA || type == prefixB)
        size = prefixed_size;
    else
        return WALLY_EINVAL;

    *value = pull_skip(cursor, max, size);
    if (!*cursor)
        return WALLY_EINVAL;
    *val_len = size;
    return WALLY_OK;
}